

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

int isStandaloneDebug(void *ctx)

{
  xmllintState *lint;
  void *ctx_local;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) == 0) {
    fprintf(_stdout,"SAX.isStandalone()\n");
  }
  return 0;
}

Assistant:

static int
isStandaloneDebug(void *ctx)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return(0);
    fprintf(stdout, "SAX.isStandalone()\n");
    return(0);
}